

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

Type * LLVMBC::Type::getIntTy(LLVMContext *context,uint32_t width)

{
  pointer *pppTVar1;
  Type *pTVar2;
  iterator __position;
  pointer ppTVar3;
  IntegerType *pIVar4;
  uint32_t local_1c;
  IntegerType *local_18;
  
  ppTVar3 = (context->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppTVar3 ==
        (context->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_1c = width;
      pIVar4 = LLVMContext::construct<LLVMBC::IntegerType,LLVMBC::LLVMContext&,unsigned_int&>
                         (context,context,&local_1c);
      __position._M_current =
           (context->type_cache).
           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (context->type_cache).
          super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_18 = pIVar4;
        std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
        _M_realloc_insert<LLVMBC::Type*>
                  ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                   &context->type_cache,__position,(Type **)&local_18);
      }
      else {
        *__position._M_current = &pIVar4->super_Type;
        pppTVar1 = &(context->type_cache).
                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      return &pIVar4->super_Type;
    }
    pTVar2 = *ppTVar3;
    if ((pTVar2->type_id == IntegerTyID) && (*(uint32_t *)&pTVar2[1].context == width)) break;
    ppTVar3 = ppTVar3 + 1;
  }
  return pTVar2;
}

Assistant:

Type *Type::getIntTy(LLVMContext &context, uint32_t width)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == TypeID::IntegerTyID && cast<IntegerType>(type)->getBitWidth() == width)
			return type;

	auto *type = context.construct<IntegerType>(context, width);
	cache.push_back(type);
	return type;
}